

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O3

string * __thiscall
DebugStream::timestamp_abi_cxx11_(string *__return_storage_ptr__,DebugStream *this,uint64_t t)

{
  bool bVar1;
  char cVar2;
  string *__str;
  char cVar3;
  ulong uVar4;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  cVar3 = '\x01';
  if ((DebugStream *)0x98967f < this) {
    uVar4 = (ulong)this / 1000000;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar4 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_00171d29;
      }
      if (uVar4 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_00171d29;
      }
      if (uVar4 < 10000) goto LAB_00171d29;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_00171d29:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,(ulong)this / 1000000);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar4 = ((ulong)this / 1000) % 1000;
  cVar3 = '\x01';
  if (9 < uVar4) {
    cVar3 = '\x03' - (uVar4 < 100);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar4);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar4 = (ulong)this % 1000;
  cVar3 = '\x01';
  if (9 < uVar4) {
    cVar3 = '\x03' - (uVar4 < 100);
  }
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar4);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string timestamp(const uint64_t t)
    {
        uint64_t us = t % 1000;
        uint64_t ms = t / 1000;
        uint64_t s = ms / 1000;
        ms = ms % 1000;
        std::string _s = std::to_string(s);
        _s += "s:";
        _s += std::to_string(ms);
        _s += "ms:";
        _s += std::to_string(us);
        _s += "us";
        return _s;
    }